

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::testCaseEnded
          (CumulativeReporterBase *this,TestCaseStats *testCaseStats)

{
  size_type sVar1;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *this_00;
  type tVar2;
  string *this_01;
  SectionNode *pSVar3;
  string *psVar4;
  long in_RSI;
  long in_RDI;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  node;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *in_stack_ffffffffffffffa8;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *in_stack_ffffffffffffffb0;
  TestCaseStats *in_stack_ffffffffffffffb8;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> *in_stack_ffffffffffffffc0;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  local_18;
  long local_10;
  
  local_10 = in_RSI;
  operator_new(0x1b8);
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>::Node
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  ::Ptr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  sVar1 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::size((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                  *)(in_RDI + 0xa8));
  if (sVar1 != 0) {
    __assert_fail("m_sectionStack.size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]arena_allocator/test/catch.hpp"
                  ,0x2104,
                  "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)"
                 );
  }
  this_00 = Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
            ::operator->(&local_18);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::push_back((vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffffb8);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ::push_back((vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
               *)this_00,(value_type *)in_stack_ffffffffffffffb8);
  Ptr<Catch::CumulativeReporterBase::SectionNode>::reset
            ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)in_stack_ffffffffffffffb0);
  tVar2 = Catch::Ptr::operator_cast_to_function_pointer
                    ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)0x189916);
  if (tVar2 != 0) {
    this_01 = (string *)(local_10 + 0x148);
    pSVar3 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator->
                       ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)(in_RDI + 0xa0));
    std::__cxx11::string::operator=((string *)&pSVar3->stdOut,this_01);
    psVar4 = (string *)(local_10 + 0x168);
    pSVar3 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator->
                       ((Ptr<Catch::CumulativeReporterBase::SectionNode> *)(in_RDI + 0xa0));
    std::__cxx11::string::operator=((string *)&pSVar3->stdErr,psVar4);
    Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
    ::~Ptr((Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
            *)this_01);
    return;
  }
  __assert_fail("m_deepestSection",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]arena_allocator/test/catch.hpp"
                ,0x2109,
                "virtual void Catch::CumulativeReporterBase::testCaseEnded(const TestCaseStats &)");
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& testCaseStats ) CATCH_OVERRIDE {
            Ptr<TestCaseNode> node = new TestCaseNode( testCaseStats );
            assert( m_sectionStack.size() == 0 );
            node->children.push_back( m_rootSection );
            m_testCases.push_back( node );
            m_rootSection.reset();

            assert( m_deepestSection );
            m_deepestSection->stdOut = testCaseStats.stdOut;
            m_deepestSection->stdErr = testCaseStats.stdErr;
        }